

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O1

void __thiscall
SAUF<UF>::PerformLabelingMem
          (SAUF<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Mat1b *pMVar5;
  pointer puVar6;
  pointer puVar7;
  pointer piVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint j;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2a8 [104];
  Mat local_240 [16];
  long local_230;
  long *local_1f8;
  Size local_1e0;
  undefined1 local_1d8 [8];
  void *pvStack_1d0;
  Size local_1c8;
  undefined4 local_170;
  Mat *local_168;
  undefined8 local_160;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar2 = *(uint *)&pMVar5->field_0x8;
  uVar3 = *(uint *)&pMVar5->field_0xc;
  UF::MemAlloc(((int)((uVar3 - ((int)(uVar3 + 1) >> 0x1f)) + 1) >> 1) *
               ((int)((uVar2 - ((int)(uVar2 + 1) >> 0x1f)) + 1) >> 1) + 1);
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar18 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_1e0 = (Size)(uVar18 << 0x20 | uVar18 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2a8,&local_1e0,0);
  *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UF::length_ = 1;
  if (0 < (int)uVar2) {
    lVar14 = -1;
    uVar18 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar17 = 0;
        do {
          lVar13 = *local_a8;
          lVar10 = uVar18 * lVar13 + local_e0;
          piVar1 = (int *)(lVar10 + uVar17 * 4);
          *piVar1 = *piVar1 + 1;
          lVar12 = *(long *)local_158._80_8_;
          lVar11 = uVar18 * lVar12 + local_158._24_8_;
          if (*(char *)(uVar17 + lVar11) != '\0') {
            if (uVar18 == 0) {
LAB_001c28a1:
              if ((uVar18 == 0) || ((long)(int)uVar3 + -1 <= (long)uVar17)) {
LAB_001c292b:
                if ((uVar17 != 0 && uVar18 != 0) &&
                   (piVar1 = (int *)(local_e0 + lVar13 * lVar14 + -4 + uVar17 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)((uVar17 - 1) + local_158._24_8_ + lVar12 * lVar14) != '\0')) {
                  lVar13 = *local_1f8;
                  piVar1 = (int *)(lVar14 * lVar13 + local_230 + -4 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar12 = *(long *)local_2a8._80_8_;
                  uVar9 = *(uint *)(lVar14 * lVar12 + local_2a8._24_8_ + -4 + uVar17 * 4);
                  goto LAB_001c2ae3;
                }
                if ((uVar17 == 0) ||
                   (piVar1 = (int *)(lVar10 + -4 + uVar17 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)((uVar17 - 1) + lVar11) == '\0')) {
                  uVar9 = UF::length_;
                  lVar13 = (long)(int)UF::length_;
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13] + 1;
                  UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13] = uVar9;
                  uVar9 = UF::length_;
                  UF::length_ = UF::length_ + 1;
                  goto LAB_001c2a77;
                }
                lVar12 = *local_1f8 * uVar18 + local_230;
                piVar1 = (int *)(lVar12 + -4 + uVar17 * 4);
                *piVar1 = *piVar1 + 1;
                lVar13 = *(long *)local_2a8._80_8_ * uVar18 + local_2a8._24_8_;
                uVar9 = *(uint *)(lVar13 + -4 + uVar17 * 4);
                piVar1 = (int *)(lVar12 + uVar17 * 4);
                *piVar1 = *piVar1 + 1;
              }
              else {
                lVar15 = lVar14 * lVar13 + local_e0;
                piVar1 = (int *)(lVar15 + 4 + uVar17 * 4);
                *piVar1 = *piVar1 + 1;
                lVar16 = lVar14 * lVar12 + local_158._24_8_;
                if (*(char *)(uVar17 + 1 + lVar16) == '\0') goto LAB_001c292b;
                if (uVar17 == 0) {
LAB_001c2aa5:
                  lVar13 = *local_1f8;
                  piVar1 = (int *)(lVar14 * lVar13 + local_230 + 4 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar12 = *(long *)local_2a8._80_8_;
                  uVar9 = *(uint *)(lVar14 * lVar12 + local_2a8._24_8_ + 4 + uVar17 * 4);
                  goto LAB_001c2ae3;
                }
                piVar1 = (int *)(lVar15 + -4 + uVar17 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((uVar17 - 1) + lVar16) == '\0') {
                  piVar1 = (int *)(lVar10 + -4 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)((uVar17 - 1) + lVar11) == '\0') goto LAB_001c2aa5;
                  lVar13 = *local_1f8;
                  piVar1 = (int *)(uVar18 * lVar13 + local_230 + -4 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar12 = *(long *)local_2a8._80_8_;
                  uVar9 = *(uint *)(uVar18 * lVar12 + local_2a8._24_8_ + -4 + uVar17 * 4);
                  piVar1 = (int *)(lVar13 * lVar14 + local_230 + 4 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                  j = *(uint *)(lVar12 * lVar14 + local_2a8._24_8_ + 4 + uVar17 * 4);
                }
                else {
                  lVar13 = *local_1f8 * lVar14 + local_230;
                  piVar1 = (int *)(lVar13 + -4 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar12 = *(long *)local_2a8._80_8_ * lVar14 + local_2a8._24_8_;
                  uVar9 = *(uint *)(lVar12 + -4 + uVar17 * 4);
                  piVar1 = (int *)(lVar13 + 4 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                  j = *(uint *)(lVar12 + 4 + uVar17 * 4);
                }
                uVar9 = UF::MemMerge(uVar9,j);
LAB_001c2a77:
                piVar1 = (int *)(*local_1f8 * uVar18 + local_230 + uVar17 * 4);
                *piVar1 = *piVar1 + 1;
                lVar13 = *(long *)local_2a8._80_8_ * uVar18 + local_2a8._24_8_;
              }
            }
            else {
              piVar1 = (int *)(lVar14 * lVar13 + local_e0 + uVar17 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar17 + lVar14 * lVar12 + local_158._24_8_) == '\0') goto LAB_001c28a1;
              lVar13 = *local_1f8;
              piVar1 = (int *)(lVar14 * lVar13 + local_230 + uVar17 * 4);
              *piVar1 = *piVar1 + 1;
              lVar12 = *(long *)local_2a8._80_8_;
              uVar9 = *(uint *)(lVar14 * lVar12 + local_2a8._24_8_ + uVar17 * 4);
LAB_001c2ae3:
              piVar1 = (int *)(lVar13 * uVar18 + local_230 + uVar17 * 4);
              *piVar1 = *piVar1 + 1;
              lVar13 = lVar12 * uVar18 + local_2a8._24_8_;
            }
            *(uint *)(lVar13 + uVar17 * 4) = uVar9;
          }
          uVar17 = uVar17 + 1;
        } while (uVar3 != uVar17);
      }
      uVar18 = uVar18 + 1;
      lVar14 = lVar14 + 1;
    } while (uVar18 != uVar2);
  }
  uVar9 = UF::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  piVar8 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)uVar2) {
    uVar18 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar14 = *local_1f8 * uVar18 + local_230;
        lVar13 = *(long *)local_2a8._80_8_ * uVar18 + local_2a8._24_8_;
        uVar17 = 0;
        do {
          piVar1 = (int *)(lVar14 + uVar17 * 4);
          *piVar1 = *piVar1 + 1;
          iVar4 = *(int *)(lVar13 + uVar17 * 4);
          piVar8[iVar4] = piVar8[iVar4] + 1;
          uVar9 = puVar7[iVar4];
          piVar1 = (int *)(lVar14 + uVar17 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar13 + uVar17 * 4) = uVar9;
          uVar17 = uVar17 + 1;
        } while (uVar3 != uVar17);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar2);
  }
  local_1d8 = (undefined1  [8])0x0;
  pvStack_1d0 = (void *)0x0;
  local_1c8.width = 0;
  local_1c8.height = 0;
  local_1d8 = (undefined1  [8])operator_new(0x20);
  pvStack_1d0 = (void *)((long)local_1d8 + 0x20);
  *(undefined8 *)((long)local_1d8 + 0x10) = 0;
  *(undefined8 *)((long)local_1d8 + 0x18) = 0;
  *(undefined8 *)local_1d8 = 0;
  *(undefined8 *)((long)local_1d8 + 8) = 0;
  local_1c8 = (Size)pvStack_1d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(accesses,local_1d8);
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8,(long)local_1c8 - (long)local_1d8);
  }
  local_160 = 0;
  local_170 = 0x81010004;
  local_168 = local_f0;
  cv::sum((_InputArray *)local_1d8);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_1d8 - 9.223372036854776e+18) & (long)(double)local_1d8 >> 0x3f |
       (long)(double)local_1d8;
  local_160 = 0;
  local_170 = 0x81010004;
  local_168 = local_240;
  cv::sum((_InputArray *)local_1d8);
  puVar6 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6[1] = (long)((double)local_1d8 - 9.223372036854776e+18) & (long)(double)local_1d8 >> 0x3f |
              (long)(double)local_1d8;
  if ((long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar18 = 0;
  }
  else {
    lVar14 = (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar19 = 0.0;
    lVar13 = 0;
    do {
      dVar19 = dVar19 + (double)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar13);
    uVar18 = (long)(dVar19 - 9.223372036854776e+18) & (long)dVar19 >> 0x3f | (long)dVar19;
  }
  puVar6[2] = uVar18;
  MemMat<int>::GetImage((Mat_<int> *)local_1d8,(MemMat<int> *)local_2a8);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_1d8);
  cv::Mat::~Mat((Mat *)local_1d8);
  cv::Mat::~Mat(local_240);
  cv::Mat::~Mat((Mat *)(local_2a8 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY); // Equivalence solver

        // Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemSetup();

        // First scan

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img(r - 1 , c - 1) > 0
#define CONDITION_Q r > 0 && img(r - 1, c)>0
#define CONDITION_R c < w - 1 && r > 0 && img(r - 1,c + 1) > 0
#define CONDITION_S c > 0 && img(r,c - 1)>0
#define CONDITION_X img(r,c)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r - 1, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"              
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::MemFlatten();

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
                img_labels(r, c) = LabelsSolver::MemGetLabel(img_labels(r, c));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }